

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapNoise(Layer *l,int *out,int x,int z,int w,int h)

{
  int x_00;
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int mod;
  uint64_t cs;
  uint64_t ss;
  int err;
  int64_t j;
  int64_t i;
  int in_stack_ffffffffffffffa8;
  uint64_t in_stack_ffffffffffffffb0;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_4;
  
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  if (local_4 == 0) {
    x_00 = 299999;
    if (*(char *)(in_RDI + 8) < '\n') {
      x_00 = 2;
    }
    for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
      for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
        if (*(int *)(in_RSI + (local_30 + local_38 * in_R8D) * 4) < 1) {
          *(undefined4 *)(in_RSI + (local_30 + local_38 * in_R8D) * 4) = 0;
        }
        else {
          in_stack_ffffffffffffffb0 =
               getChunkSeed(in_stack_ffffffffffffffb0,x_00,in_stack_ffffffffffffffa8);
          iVar1 = mcFirstInt(in_stack_ffffffffffffffb0,x_00);
          *(int *)(in_RSI + (local_30 + local_38 * in_R8D) * 4) = iVar1 + 2;
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapNoise(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    int mod = (l->mc <= MC_1_6) ? 2 : 299999;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            if (out[i + j*w] > 0)
            {
                cs = getChunkSeed(ss, i + x, j + z);
                out[i + j*w] = mcFirstInt(cs, mod)+2;
            }
            else
            {
                out[i + j*w] = 0;
            }
        }
    }

    return 0;
}